

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 float32_gen2(float32 xa,float32 xb,float_status *s,hard_f32_op2_fn hard,soft_f32_op2_fn soft
                    ,f32_check_fn pre,f32_check_fn post,f32_check_fn fast_test,
                    soft_f32_op2_fn fast_op)

{
  _Bool _Var1;
  float32 fVar2;
  float fVar3;
  union_float32 ub;
  union_float32 ua;
  union_float32 local_58;
  union_float32 local_54;
  f32_check_fn local_50;
  soft_f32_op2_fn local_48;
  soft_f32_op2_fn local_40;
  hard_f32_op2_fn local_38;
  
  local_58.s = xb;
  local_54.s = xa;
  local_48 = soft;
  if ((s->float_exception_flags & 0x20) != 0) {
    local_40 = fast_op;
    local_50 = post;
    local_38 = hard;
    if (s->float_rounding_mode == '\0') {
      float32_input_flush2(&local_54.s,&local_58.s,s);
      xa = local_54.s;
      xb = local_58.s;
      _Var1 = (*pre)(local_54,local_58);
      soft = local_48;
      if ((_Var1) &&
         ((fast_test == (f32_check_fn)0x0 ||
          (_Var1 = (*fast_test)((union_float32)xa,(union_float32)xb), soft = local_40, !_Var1)))) {
        fVar3 = (*local_38)((float)xa,(float)xb);
        if (ABS(fVar3) == INFINITY) {
          s->float_exception_flags = s->float_exception_flags | 8;
        }
        else if ((ABS(fVar3) <= 1.1754944e-38) &&
                ((soft = local_48, local_50 == (f32_check_fn)0x0 ||
                 (_Var1 = (*local_50)((union_float32)xa,(union_float32)xb), soft = local_48, _Var1))
                )) goto LAB_00b14799;
        return (float32)fVar3;
      }
    }
  }
LAB_00b14799:
  fVar2 = (*soft)(xa,xb,s);
  return fVar2;
}

Assistant:

static inline float32
float32_gen2(float32 xa, float32 xb, float_status *s,
             hard_f32_op2_fn hard, soft_f32_op2_fn soft,
             f32_check_fn pre, f32_check_fn post,
             f32_check_fn fast_test, soft_f32_op2_fn fast_op)
{
    union_float32 ua, ub, ur;

    ua.s = xa;
    ub.s = xb;

    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }

    float32_input_flush2(&ua.s, &ub.s, s);
    if (unlikely(!pre(ua, ub))) {
        goto soft;
    }
    if (fast_test && fast_test(ua, ub)) {
        return fast_op(ua.s, ub.s, s);
    }

    ur.h = hard(ua.h, ub.h);
    if (unlikely(f32_is_inf(ur))) {
        s->float_exception_flags |= float_flag_overflow;
    } else if (unlikely(fabsf(ur.h) <= FLT_MIN)) {
        if (post == NULL || post(ua, ub)) {
            goto soft;
        }
    }
    return ur.s;

 soft:
    return soft(ua.s, ub.s, s);
}